

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

bool embree::avx512::
     BVHNIntersector1<8,_1,_false,_embree::avx512::SubGridIntersector1Moeller<8,_true>_>::pointQuery
               (Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float *pfVar1;
  ulong *puVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint uVar12;
  uint uVar13;
  Geometry *this;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  long lVar32;
  ulong uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  bool bVar38;
  byte bVar39;
  bool bVar40;
  int iVar41;
  long lVar42;
  ulong uVar43;
  ulong *puVar44;
  ulong in_R9;
  long lVar45;
  ulong uVar46;
  byte bVar47;
  ulong uVar48;
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  float fVar61;
  undefined1 auVar62 [16];
  float fVar68;
  float fVar69;
  float fVar71;
  float fVar72;
  float fVar73;
  undefined1 auVar63 [32];
  float fVar70;
  float fVar74;
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  float fVar82;
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [16];
  undefined1 auVar88 [64];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 in_ZMM14 [64];
  undefined1 auVar92 [64];
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 == 8) {
    return false;
  }
  local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  local_2370[0] = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    auVar88 = ZEXT464((uint)(query->radius * query->radius));
  }
  else {
    aVar7 = (context->query_radius).field_0;
    auVar87 = vdpps_avx((undefined1  [16])aVar7,(undefined1  [16])aVar7,0x7f);
    auVar88 = ZEXT1664(auVar87);
  }
  puVar44 = local_2368;
  fVar3 = (query->p).field_0.field_0.x;
  auVar89._4_4_ = fVar3;
  auVar89._0_4_ = fVar3;
  auVar89._8_4_ = fVar3;
  auVar89._12_4_ = fVar3;
  auVar89._16_4_ = fVar3;
  auVar89._20_4_ = fVar3;
  auVar89._24_4_ = fVar3;
  auVar89._28_4_ = fVar3;
  fVar4 = (query->p).field_0.field_0.y;
  auVar90._4_4_ = fVar4;
  auVar90._0_4_ = fVar4;
  auVar90._8_4_ = fVar4;
  auVar90._12_4_ = fVar4;
  auVar90._16_4_ = fVar4;
  auVar90._20_4_ = fVar4;
  auVar90._24_4_ = fVar4;
  auVar90._28_4_ = fVar4;
  fVar5 = (query->p).field_0.field_0.z;
  auVar91._4_4_ = fVar5;
  auVar91._0_4_ = fVar5;
  auVar91._8_4_ = fVar5;
  auVar91._12_4_ = fVar5;
  auVar91._16_4_ = fVar5;
  auVar91._20_4_ = fVar5;
  auVar91._24_4_ = fVar5;
  auVar91._28_4_ = fVar5;
  uVar6 = *(undefined4 *)&(context->query_radius).field_0;
  auVar56._4_4_ = uVar6;
  auVar56._0_4_ = uVar6;
  auVar56._8_4_ = uVar6;
  auVar56._12_4_ = uVar6;
  auVar56._16_4_ = uVar6;
  auVar56._20_4_ = uVar6;
  auVar56._24_4_ = uVar6;
  auVar56._28_4_ = uVar6;
  uVar6 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar63._4_4_ = uVar6;
  auVar63._0_4_ = uVar6;
  auVar63._8_4_ = uVar6;
  auVar63._12_4_ = uVar6;
  auVar63._16_4_ = uVar6;
  auVar63._20_4_ = uVar6;
  auVar63._24_4_ = uVar6;
  auVar63._28_4_ = uVar6;
  uVar6 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar76._4_4_ = uVar6;
  auVar76._0_4_ = uVar6;
  auVar76._8_4_ = uVar6;
  auVar76._12_4_ = uVar6;
  auVar76._16_4_ = uVar6;
  auVar76._20_4_ = uVar6;
  auVar76._24_4_ = uVar6;
  auVar76._28_4_ = uVar6;
  bVar40 = false;
  auVar22 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar85 = ZEXT3264(auVar22);
  auVar86 = ZEXT3264(CONCAT428(0xfffffff8,
                               CONCAT424(0xfffffff8,
                                         CONCAT420(0xfffffff8,
                                                   CONCAT416(0xfffffff8,
                                                             CONCAT412(0xfffffff8,
                                                                       CONCAT48(0xfffffff8,
                                                                                0xfffffff8fffffff8))
                                                            )))));
  do {
    auVar22 = vsubps_avx(auVar89,auVar56);
    fVar14 = auVar56._0_4_;
    fVar15 = auVar56._4_4_;
    fVar16 = auVar56._8_4_;
    fVar17 = auVar56._12_4_;
    fVar18 = auVar56._16_4_;
    fVar19 = auVar56._20_4_;
    fVar20 = auVar56._24_4_;
    fVar82 = fVar3 + auVar56._28_4_;
    auVar56 = vsubps_avx(auVar90,auVar63);
    fVar61 = fVar4 + auVar63._0_4_;
    fVar68 = fVar4 + auVar63._4_4_;
    fVar69 = fVar4 + auVar63._8_4_;
    fVar70 = fVar4 + auVar63._12_4_;
    fVar71 = fVar4 + auVar63._16_4_;
    fVar72 = fVar4 + auVar63._20_4_;
    fVar73 = fVar4 + auVar63._24_4_;
    fVar74 = fVar4 + auVar63._28_4_;
    auVar63 = vsubps_avx(auVar91,auVar76);
    auVar64._0_4_ = fVar5 + auVar76._0_4_;
    auVar64._4_4_ = fVar5 + auVar76._4_4_;
    auVar64._8_4_ = fVar5 + auVar76._8_4_;
    auVar64._12_4_ = fVar5 + auVar76._12_4_;
    auVar64._16_4_ = fVar5 + auVar76._16_4_;
    auVar64._20_4_ = fVar5 + auVar76._20_4_;
    auVar64._24_4_ = fVar5 + auVar76._24_4_;
    auVar64._28_4_ = fVar5 + auVar76._28_4_;
    auVar92._0_4_ = fVar14 * fVar14;
    auVar92._4_4_ = fVar15 * fVar15;
    auVar92._8_4_ = fVar16 * fVar16;
    auVar92._12_4_ = fVar17 * fVar17;
    auVar92._16_4_ = fVar18 * fVar18;
    auVar92._20_4_ = fVar19 * fVar19;
    auVar92._28_36_ = in_ZMM14._28_36_;
    auVar92._24_4_ = fVar20 * fVar20;
    auVar76 = auVar92._0_32_;
    auVar87 = auVar88._0_16_;
    do {
      do {
        do {
          if (puVar44 == &local_2378) {
            return bVar40;
          }
          pfVar1 = (float *)(puVar44 + -1);
          puVar44 = puVar44 + -2;
        } while (auVar88._0_4_ < *pfVar1);
        uVar48 = *puVar44;
        do {
          if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
            if ((uVar48 & 8) == 0) {
              auVar51 = vmaxps_avx(auVar89,*(undefined1 (*) [32])(uVar48 + 0x40));
              auVar51 = vminps_avx(auVar51,*(undefined1 (*) [32])(uVar48 + 0x60));
              auVar49 = vsubps_avx(auVar51,auVar89);
              auVar51 = vmaxps_avx(auVar90,*(undefined1 (*) [32])(uVar48 + 0x80));
              auVar21 = vminps_avx(auVar51,*(undefined1 (*) [32])(uVar48 + 0xa0));
              auVar51 = vmaxps_avx(auVar91,*(undefined1 (*) [32])(uVar48 + 0xc0));
              auVar21 = vsubps_avx(auVar21,auVar90);
              auVar51 = vminps_avx(auVar51,*(undefined1 (*) [32])(uVar48 + 0xe0));
              auVar51 = vsubps_avx(auVar51,auVar91);
              auVar50._0_4_ =
                   auVar49._0_4_ * auVar49._0_4_ + auVar21._0_4_ * auVar21._0_4_ +
                   auVar51._0_4_ * auVar51._0_4_;
              auVar50._4_4_ =
                   auVar49._4_4_ * auVar49._4_4_ + auVar21._4_4_ * auVar21._4_4_ +
                   auVar51._4_4_ * auVar51._4_4_;
              auVar50._8_4_ =
                   auVar49._8_4_ * auVar49._8_4_ + auVar21._8_4_ * auVar21._8_4_ +
                   auVar51._8_4_ * auVar51._8_4_;
              auVar50._12_4_ =
                   auVar49._12_4_ * auVar49._12_4_ + auVar21._12_4_ * auVar21._12_4_ +
                   auVar51._12_4_ * auVar51._12_4_;
              auVar50._16_4_ =
                   auVar49._16_4_ * auVar49._16_4_ + auVar21._16_4_ * auVar21._16_4_ +
                   auVar51._16_4_ * auVar51._16_4_;
              auVar50._20_4_ =
                   auVar49._20_4_ * auVar49._20_4_ + auVar21._20_4_ * auVar21._20_4_ +
                   auVar51._20_4_ * auVar51._20_4_;
              auVar50._24_4_ =
                   auVar49._24_4_ * auVar49._24_4_ + auVar21._24_4_ * auVar21._24_4_ +
                   auVar51._24_4_ * auVar51._24_4_;
              auVar50._28_4_ = auVar49._28_4_ + auVar21._28_4_ + auVar21._28_4_;
              in_ZMM6 = ZEXT3264(auVar50);
              uVar24 = vcmpps_avx512vl(auVar50,auVar76,2);
              uVar25 = vcmpps_avx512vl(*(undefined1 (*) [32])(uVar48 + 0x40),
                                       *(undefined1 (*) [32])(uVar48 + 0x60),2);
              in_R9 = CONCAT44((int)(in_R9 >> 0x20),(uint)(byte)((byte)uVar24 & (byte)uVar25));
            }
          }
          else if ((uVar48 & 8) == 0) {
            auVar51 = *(undefined1 (*) [32])(uVar48 + 0x40);
            auVar21 = *(undefined1 (*) [32])(uVar48 + 0x60);
            auVar49 = vmaxps_avx(auVar89,auVar51);
            auVar49 = vminps_avx(auVar49,auVar21);
            auVar50 = vsubps_avx(auVar49,auVar89);
            auVar49 = vmaxps_avx(auVar90,*(undefined1 (*) [32])(uVar48 + 0x80));
            auVar49 = vminps_avx(auVar49,*(undefined1 (*) [32])(uVar48 + 0xa0));
            auVar53 = vsubps_avx(auVar49,auVar90);
            auVar49 = vmaxps_avx(auVar91,*(undefined1 (*) [32])(uVar48 + 0xc0));
            auVar49 = vminps_avx(auVar49,*(undefined1 (*) [32])(uVar48 + 0xe0));
            auVar49 = vsubps_avx(auVar49,auVar91);
            auVar86 = ZEXT3264(CONCAT428(0xfffffff8,
                                         CONCAT424(0xfffffff8,
                                                   CONCAT420(0xfffffff8,
                                                             CONCAT416(0xfffffff8,
                                                                       CONCAT412(0xfffffff8,
                                                                                 CONCAT48(0xfffffff8
                                                                                          ,
                                                  0xfffffff8fffffff8)))))));
            in_ZMM6 = ZEXT3264(CONCAT428(auVar50._28_4_ + auVar53._28_4_ + auVar53._28_4_,
                                         CONCAT424(auVar50._24_4_ * auVar50._24_4_ +
                                                   auVar53._24_4_ * auVar53._24_4_ +
                                                   auVar49._24_4_ * auVar49._24_4_,
                                                   CONCAT420(auVar50._20_4_ * auVar50._20_4_ +
                                                             auVar53._20_4_ * auVar53._20_4_ +
                                                             auVar49._20_4_ * auVar49._20_4_,
                                                             CONCAT416(auVar50._16_4_ *
                                                                       auVar50._16_4_ +
                                                                       auVar53._16_4_ *
                                                                       auVar53._16_4_ +
                                                                       auVar49._16_4_ *
                                                                       auVar49._16_4_,
                                                                       CONCAT412(auVar50._12_4_ *
                                                                                 auVar50._12_4_ +
                                                                                 auVar53._12_4_ *
                                                                                 auVar53._12_4_ +
                                                                                 auVar49._12_4_ *
                                                                                 auVar49._12_4_,
                                                                                 CONCAT48(auVar50.
                                                  _8_4_ * auVar50._8_4_ +
                                                  auVar53._8_4_ * auVar53._8_4_ +
                                                  auVar49._8_4_ * auVar49._8_4_,
                                                  CONCAT44(auVar50._4_4_ * auVar50._4_4_ +
                                                           auVar53._4_4_ * auVar53._4_4_ +
                                                           auVar49._4_4_ * auVar49._4_4_,
                                                           auVar50._0_4_ * auVar50._0_4_ +
                                                           auVar53._0_4_ * auVar53._0_4_ +
                                                           auVar49._0_4_ * auVar49._0_4_))))))));
            auVar49 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
            auVar85 = ZEXT3264(auVar49);
            uVar24 = vcmpps_avx512vl(auVar51,auVar21,2);
            uVar25 = vcmpps_avx512vl(auVar21,auVar22,1);
            auVar21._4_4_ = fVar3 + fVar15;
            auVar21._0_4_ = fVar3 + fVar14;
            auVar21._8_4_ = fVar3 + fVar16;
            auVar21._12_4_ = fVar3 + fVar17;
            auVar21._16_4_ = fVar3 + fVar18;
            auVar21._20_4_ = fVar3 + fVar19;
            auVar21._24_4_ = fVar3 + fVar20;
            auVar21._28_4_ = fVar82;
            uVar30 = vcmpps_avx512vl(auVar51,auVar21,6);
            uVar26 = vcmpps_avx512vl(*(undefined1 (*) [32])(uVar48 + 0xa0),auVar56,1);
            auVar51._4_4_ = fVar68;
            auVar51._0_4_ = fVar61;
            auVar51._8_4_ = fVar69;
            auVar51._12_4_ = fVar70;
            auVar51._16_4_ = fVar71;
            auVar51._20_4_ = fVar72;
            auVar51._24_4_ = fVar73;
            auVar51._28_4_ = fVar74;
            uVar27 = vcmpps_avx512vl(*(undefined1 (*) [32])(uVar48 + 0x80),auVar51,6);
            uVar28 = vcmpps_avx512vl(*(undefined1 (*) [32])(uVar48 + 0xe0),auVar63,1);
            uVar29 = vcmpps_avx512vl(*(undefined1 (*) [32])(uVar48 + 0xc0),auVar64,6);
            in_R9 = (ulong)(byte)(~((byte)uVar27 | (byte)uVar30 | (byte)uVar29 | (byte)uVar25 |
                                   (byte)uVar26 | (byte)uVar28) & (byte)uVar24);
          }
          if ((uVar48 & 8) == 0) {
            if (in_R9 == 0) {
              iVar41 = 4;
            }
            else {
              auVar51 = *(undefined1 (*) [32])(uVar48 & 0xfffffffffffffff0);
              auVar21 = ((undefined1 (*) [32])(uVar48 & 0xfffffffffffffff0))[1];
              auVar84 = in_ZMM6._0_32_;
              auVar49 = vpternlogd_avx512vl(auVar85._0_32_,auVar84,auVar86._0_32_,0xf8);
              uVar48 = in_R9 & 0xffffffff;
              auVar50 = vpcompressd_avx512vl(auVar49);
              bVar38 = (bool)((byte)uVar48 & 1);
              auVar53._0_4_ = (uint)bVar38 * auVar50._0_4_ | (uint)!bVar38 * auVar49._0_4_;
              bVar38 = (bool)((byte)(uVar48 >> 1) & 1);
              auVar53._4_4_ = (uint)bVar38 * auVar50._4_4_ | (uint)!bVar38 * auVar49._4_4_;
              bVar38 = (bool)((byte)(uVar48 >> 2) & 1);
              auVar53._8_4_ = (uint)bVar38 * auVar50._8_4_ | (uint)!bVar38 * auVar49._8_4_;
              bVar38 = (bool)((byte)(uVar48 >> 3) & 1);
              auVar53._12_4_ = (uint)bVar38 * auVar50._12_4_ | (uint)!bVar38 * auVar49._12_4_;
              bVar38 = (bool)((byte)(uVar48 >> 4) & 1);
              auVar53._16_4_ = (uint)bVar38 * auVar50._16_4_ | (uint)!bVar38 * auVar49._16_4_;
              bVar38 = (bool)((byte)(uVar48 >> 5) & 1);
              auVar53._20_4_ = (uint)bVar38 * auVar50._20_4_ | (uint)!bVar38 * auVar49._20_4_;
              bVar38 = (bool)((byte)(uVar48 >> 6) & 1);
              auVar53._24_4_ = (uint)bVar38 * auVar50._24_4_ | (uint)!bVar38 * auVar49._24_4_;
              bVar38 = (bool)((byte)(uVar48 >> 7) & 1);
              auVar53._28_4_ = (uint)bVar38 * auVar50._28_4_ | (uint)!bVar38 * auVar49._28_4_;
              auVar49 = vpermt2q_avx512vl(auVar51,auVar53,auVar21);
              uVar48 = auVar49._0_8_;
              iVar41 = 0;
              uVar43 = in_R9 - 1 & in_R9;
              if (uVar43 != 0) {
                auVar49 = vpshufd_avx2(auVar53,0x55);
                vpermt2q_avx512vl(auVar51,auVar49,auVar21);
                auVar50 = vpminsd_avx2(auVar53,auVar49);
                auVar49 = vpmaxsd_avx2(auVar53,auVar49);
                uVar43 = uVar43 - 1 & uVar43;
                if (uVar43 == 0) {
                  auVar50 = vpermi2q_avx512vl(auVar50,auVar51,auVar21);
                  uVar48 = auVar50._0_8_;
                  auVar51 = vpermt2q_avx512vl(auVar51,auVar49,auVar21);
                  *puVar44 = auVar51._0_8_;
                  auVar51 = vpermd_avx2(auVar49,auVar84);
                  *(int *)(puVar44 + 1) = auVar51._0_4_;
                  puVar44 = puVar44 + 2;
                }
                else {
                  auVar23 = vpshufd_avx2(auVar53,0xaa);
                  vpermt2q_avx512vl(auVar51,auVar23,auVar21);
                  auVar54 = vpminsd_avx2(auVar50,auVar23);
                  auVar50 = vpmaxsd_avx2(auVar50,auVar23);
                  auVar23 = vpminsd_avx2(auVar49,auVar50);
                  auVar49 = vpmaxsd_avx2(auVar49,auVar50);
                  uVar43 = uVar43 - 1 & uVar43;
                  if (uVar43 == 0) {
                    auVar50 = vpermi2q_avx512vl(auVar54,auVar51,auVar21);
                    uVar48 = auVar50._0_8_;
                    auVar50 = vpermt2q_avx512vl(auVar51,auVar49,auVar21);
                    *puVar44 = auVar50._0_8_;
                    auVar49 = vpermd_avx2(auVar49,auVar84);
                    in_ZMM6 = ZEXT3264(auVar84);
                    *(int *)(puVar44 + 1) = auVar49._0_4_;
                    auVar51 = vpermt2q_avx512vl(auVar51,auVar23,auVar21);
                    puVar44[2] = auVar51._0_8_;
                    auVar51 = vpermd_avx2(auVar23,auVar84);
                    *(int *)(puVar44 + 3) = auVar51._0_4_;
                    puVar44 = puVar44 + 4;
                  }
                  else {
                    auVar50 = vpshufd_avx2(auVar53,0xff);
                    vpermt2q_avx512vl(auVar51,auVar50,auVar21);
                    auVar77 = vpminsd_avx2(auVar54,auVar50);
                    auVar50 = vpmaxsd_avx2(auVar54,auVar50);
                    auVar54 = vpminsd_avx2(auVar23,auVar50);
                    auVar50 = vpmaxsd_avx2(auVar23,auVar50);
                    auVar23 = vpminsd_avx2(auVar49,auVar50);
                    auVar49 = vpmaxsd_avx2(auVar49,auVar50);
                    uVar43 = uVar43 - 1 & uVar43;
                    if (uVar43 == 0) {
                      auVar50 = vpermi2q_avx512vl(auVar77,auVar51,auVar21);
                      uVar48 = auVar50._0_8_;
                      auVar50 = vpermt2q_avx512vl(auVar51,auVar49,auVar21);
                      *puVar44 = auVar50._0_8_;
                      auVar49 = vpermd_avx2(auVar49,auVar84);
                      *(int *)(puVar44 + 1) = auVar49._0_4_;
                      auVar49 = vpermt2q_avx512vl(auVar51,auVar23,auVar21);
                      puVar44[2] = auVar49._0_8_;
                      auVar49 = vpermd_avx2(auVar23,auVar84);
                      *(int *)(puVar44 + 3) = auVar49._0_4_;
                      auVar51 = vpermt2q_avx512vl(auVar51,auVar54,auVar21);
                      puVar44[4] = auVar51._0_8_;
                      auVar51 = vpermd_avx2(auVar54,auVar84);
                      *(int *)(puVar44 + 5) = auVar51._0_4_;
                      puVar44 = puVar44 + 6;
                      auVar51 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
                    }
                    else {
                      auVar52 = valignd_avx512vl(auVar53,auVar53,3);
                      auVar50 = vpmovsxbd_avx2(ZEXT816(0x303020108));
                      auVar53 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                     CONCAT48(0x80000000,
                                                                              0x8000000080000000))),
                                                  auVar50,auVar77);
                      auVar50 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                      auVar53 = vpermt2d_avx512vl(auVar53,auVar50,auVar54);
                      auVar53 = vpermt2d_avx512vl(auVar53,auVar50,auVar23);
                      auVar50 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                      auVar49 = vpermt2d_avx512vl(auVar53,auVar50,auVar49);
                      auVar85 = ZEXT3264(auVar49);
                      uVar48 = uVar43;
                      do {
                        auVar50 = auVar85._0_32_;
                        auVar49._8_4_ = 1;
                        auVar49._0_8_ = 0x100000001;
                        auVar49._12_4_ = 1;
                        auVar49._16_4_ = 1;
                        auVar49._20_4_ = 1;
                        auVar49._24_4_ = 1;
                        auVar49._28_4_ = 1;
                        auVar49 = vpermd_avx2(auVar49,auVar52);
                        auVar52 = valignd_avx512vl(auVar52,auVar52,1);
                        vpermt2q_avx512vl(auVar51,auVar52,auVar21);
                        uVar48 = uVar48 - 1 & uVar48;
                        uVar24 = vpcmpd_avx512vl(auVar49,auVar50,5);
                        auVar49 = vpmaxsd_avx2(auVar49,auVar50);
                        bVar47 = (byte)uVar24 << 1;
                        auVar50 = valignd_avx512vl(auVar50,auVar50,7);
                        bVar38 = (bool)((byte)uVar24 & 1);
                        auVar54._4_4_ = (uint)bVar38 * auVar50._4_4_ | (uint)!bVar38 * auVar49._4_4_
                        ;
                        auVar54._0_4_ = auVar49._0_4_;
                        bVar38 = (bool)(bVar47 >> 2 & 1);
                        auVar54._8_4_ = (uint)bVar38 * auVar50._8_4_ | (uint)!bVar38 * auVar49._8_4_
                        ;
                        bVar38 = (bool)(bVar47 >> 3 & 1);
                        auVar54._12_4_ =
                             (uint)bVar38 * auVar50._12_4_ | (uint)!bVar38 * auVar49._12_4_;
                        bVar38 = (bool)(bVar47 >> 4 & 1);
                        auVar54._16_4_ =
                             (uint)bVar38 * auVar50._16_4_ | (uint)!bVar38 * auVar49._16_4_;
                        bVar38 = (bool)(bVar47 >> 5 & 1);
                        auVar54._20_4_ =
                             (uint)bVar38 * auVar50._20_4_ | (uint)!bVar38 * auVar49._20_4_;
                        bVar38 = (bool)(bVar47 >> 6 & 1);
                        auVar54._24_4_ =
                             (uint)bVar38 * auVar50._24_4_ | (uint)!bVar38 * auVar49._24_4_;
                        auVar54._28_4_ =
                             (uint)(bVar47 >> 7) * auVar50._28_4_ |
                             (uint)!(bool)(bVar47 >> 7) * auVar49._28_4_;
                        auVar85 = ZEXT3264(auVar54);
                      } while (uVar48 != 0);
                      lVar42 = POPCOUNT(uVar43) + 3;
                      do {
                        auVar49 = vpermi2q_avx512vl(auVar54,auVar51,auVar21);
                        *puVar44 = auVar49._0_8_;
                        auVar50 = auVar85._0_32_;
                        auVar49 = vpermd_avx2(auVar50,auVar84);
                        *(int *)(puVar44 + 1) = auVar49._0_4_;
                        auVar54 = valignd_avx512vl(auVar50,auVar50,1);
                        puVar44 = puVar44 + 2;
                        auVar85 = ZEXT3264(auVar54);
                        lVar42 = lVar42 + -1;
                      } while (lVar42 != 0);
                      auVar51 = vpermt2q_avx512vl(auVar51,auVar54,auVar21);
                      uVar48 = auVar51._0_8_;
                      auVar51 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
                    }
                    auVar86 = ZEXT3264(CONCAT428(0xfffffff8,
                                                 CONCAT424(0xfffffff8,
                                                           CONCAT420(0xfffffff8,
                                                                     CONCAT416(0xfffffff8,
                                                                               CONCAT412(0xfffffff8,
                                                                                         CONCAT48(
                                                  0xfffffff8,0xfffffff8fffffff8)))))));
                    auVar85 = ZEXT3264(auVar51);
                    in_ZMM6 = ZEXT3264(auVar84);
                    iVar41 = 0;
                  }
                }
              }
            }
          }
          else {
            iVar41 = 6;
          }
        } while (iVar41 == 0);
      } while ((iVar41 != 6) || (uVar43 = (ulong)((uint)uVar48 & 0xf), uVar43 == 8));
      bVar47 = 0;
      lVar42 = 0;
      do {
        puVar2 = (ulong *)((uVar48 & 0xfffffffffffffff0) + 0x40 + lVar42 * 0x90);
        if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
          uVar6 = (undefined4)puVar2[6];
          auVar57._4_4_ = uVar6;
          auVar57._0_4_ = uVar6;
          auVar57._8_4_ = uVar6;
          auVar57._12_4_ = uVar6;
          auVar57._16_4_ = uVar6;
          auVar57._20_4_ = uVar6;
          auVar57._24_4_ = uVar6;
          auVar57._28_4_ = uVar6;
          uVar6 = *(undefined4 *)((long)puVar2 + 0x3c);
          auVar65._4_4_ = uVar6;
          auVar65._0_4_ = uVar6;
          auVar65._8_4_ = uVar6;
          auVar65._12_4_ = uVar6;
          auVar65._16_4_ = uVar6;
          auVar65._20_4_ = uVar6;
          auVar65._24_4_ = uVar6;
          auVar65._28_4_ = uVar6;
          auVar75._8_8_ = 0;
          auVar75._0_8_ = *puVar2;
          auVar51 = vpmovzxbd_avx2(auVar75);
          auVar51 = vcvtdq2ps_avx(auVar51);
          auVar34 = vfmadd213ps_fma(auVar51,auVar65,auVar57);
          auVar83._8_8_ = 0;
          auVar83._0_8_ = puVar2[1];
          auVar51 = vpmovzxbd_avx2(auVar83);
          auVar51 = vcvtdq2ps_avx(auVar51);
          auVar35 = vfmadd213ps_fma(auVar51,auVar65,auVar57);
          uVar6 = *(undefined4 *)((long)puVar2 + 0x34);
          auVar58._4_4_ = uVar6;
          auVar58._0_4_ = uVar6;
          auVar58._8_4_ = uVar6;
          auVar58._12_4_ = uVar6;
          auVar58._16_4_ = uVar6;
          auVar58._20_4_ = uVar6;
          auVar58._24_4_ = uVar6;
          auVar58._28_4_ = uVar6;
          uVar6 = (undefined4)puVar2[8];
          auVar66._4_4_ = uVar6;
          auVar66._0_4_ = uVar6;
          auVar66._8_4_ = uVar6;
          auVar66._12_4_ = uVar6;
          auVar66._16_4_ = uVar6;
          auVar66._20_4_ = uVar6;
          auVar66._24_4_ = uVar6;
          auVar66._28_4_ = uVar6;
          auVar8._8_8_ = 0;
          auVar8._0_8_ = puVar2[2];
          auVar51 = vpmovzxbd_avx2(auVar8);
          auVar51 = vcvtdq2ps_avx(auVar51);
          auVar36 = vfmadd213ps_fma(auVar51,auVar66,auVar58);
          auVar9._8_8_ = 0;
          auVar9._0_8_ = puVar2[3];
          auVar51 = vpmovzxbd_avx2(auVar9);
          auVar51 = vcvtdq2ps_avx(auVar51);
          auVar37 = vfmadd213ps_fma(auVar51,auVar66,auVar58);
          uVar6 = (undefined4)puVar2[7];
          auVar59._4_4_ = uVar6;
          auVar59._0_4_ = uVar6;
          auVar59._8_4_ = uVar6;
          auVar59._12_4_ = uVar6;
          auVar59._16_4_ = uVar6;
          auVar59._20_4_ = uVar6;
          auVar59._24_4_ = uVar6;
          auVar59._28_4_ = uVar6;
          uVar6 = *(undefined4 *)((long)puVar2 + 0x44);
          auVar67._4_4_ = uVar6;
          auVar67._0_4_ = uVar6;
          auVar67._8_4_ = uVar6;
          auVar67._12_4_ = uVar6;
          auVar67._16_4_ = uVar6;
          auVar67._20_4_ = uVar6;
          auVar67._24_4_ = uVar6;
          auVar67._28_4_ = uVar6;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = puVar2[4];
          auVar51 = vpmovzxbd_avx2(auVar10);
          auVar51 = vcvtdq2ps_avx(auVar51);
          auVar55 = vfmadd213ps_fma(auVar51,auVar67,auVar59);
          auVar11._8_8_ = 0;
          auVar11._0_8_ = puVar2[5];
          auVar51 = vpmovzxbd_avx2(auVar11);
          auVar51 = vcvtdq2ps_avx(auVar51);
          auVar62 = vfmadd213ps_fma(auVar51,auVar67,auVar59);
          auVar51 = vmaxps_avx(auVar89,ZEXT1632(auVar34));
          auVar51 = vminps_avx(auVar51,ZEXT1632(auVar35));
          auVar21 = vsubps_avx(auVar51,auVar89);
          auVar51 = vmaxps_avx(auVar90,ZEXT1632(auVar36));
          auVar51 = vminps_avx(auVar51,ZEXT1632(auVar37));
          auVar49 = vsubps_avx(auVar51,auVar90);
          auVar51 = vmaxps_avx(auVar91,ZEXT1632(auVar55));
          auVar51 = vminps_avx(auVar51,ZEXT1632(auVar62));
          auVar51 = vsubps_avx(auVar51,auVar91);
          auVar60._0_4_ =
               auVar21._0_4_ * auVar21._0_4_ + auVar49._0_4_ * auVar49._0_4_ +
               auVar51._0_4_ * auVar51._0_4_;
          auVar60._4_4_ =
               auVar21._4_4_ * auVar21._4_4_ + auVar49._4_4_ * auVar49._4_4_ +
               auVar51._4_4_ * auVar51._4_4_;
          auVar60._8_4_ =
               auVar21._8_4_ * auVar21._8_4_ + auVar49._8_4_ * auVar49._8_4_ +
               auVar51._8_4_ * auVar51._8_4_;
          auVar60._12_4_ =
               auVar21._12_4_ * auVar21._12_4_ + auVar49._12_4_ * auVar49._12_4_ +
               auVar51._12_4_ * auVar51._12_4_;
          auVar60._16_4_ =
               auVar21._16_4_ * auVar21._16_4_ + auVar49._16_4_ * auVar49._16_4_ +
               auVar51._16_4_ * auVar51._16_4_;
          auVar60._20_4_ =
               auVar21._20_4_ * auVar21._20_4_ + auVar49._20_4_ * auVar49._20_4_ +
               auVar51._20_4_ * auVar51._20_4_;
          auVar60._24_4_ =
               auVar21._24_4_ * auVar21._24_4_ + auVar49._24_4_ * auVar49._24_4_ +
               auVar51._24_4_ * auVar51._24_4_;
          auVar60._28_4_ = auVar21._28_4_ + auVar49._28_4_ + auVar49._28_4_;
          uVar24 = vcmpps_avx512vl(ZEXT1632(auVar34),ZEXT1632(auVar35),2);
          uVar30 = vpcmpub_avx512vl(auVar75,auVar83,2);
          uVar25 = vcmpps_avx512vl(auVar60,auVar76,2);
          bVar39 = (byte)uVar24 & (byte)uVar25 & (byte)uVar30;
        }
        else {
          auVar55._8_8_ = 0;
          auVar55._0_8_ = *puVar2;
          auVar62._8_8_ = 0;
          auVar62._0_8_ = puVar2[1];
          uVar31 = vpcmpub_avx512vl(auVar55,auVar62,2);
          uVar6 = (undefined4)puVar2[6];
          auVar77._4_4_ = uVar6;
          auVar77._0_4_ = uVar6;
          auVar77._8_4_ = uVar6;
          auVar77._12_4_ = uVar6;
          auVar77._16_4_ = uVar6;
          auVar77._20_4_ = uVar6;
          auVar77._24_4_ = uVar6;
          auVar77._28_4_ = uVar6;
          uVar6 = *(undefined4 *)((long)puVar2 + 0x3c);
          auVar79._4_4_ = uVar6;
          auVar79._0_4_ = uVar6;
          auVar79._8_4_ = uVar6;
          auVar79._12_4_ = uVar6;
          auVar79._16_4_ = uVar6;
          auVar79._20_4_ = uVar6;
          auVar79._24_4_ = uVar6;
          auVar79._28_4_ = uVar6;
          auVar51 = vpmovzxbd_avx2(auVar55);
          auVar51 = vcvtdq2ps_avx(auVar51);
          auVar55 = vfmadd213ps_fma(auVar51,auVar79,auVar77);
          auVar51 = vpmovzxbd_avx2(auVar62);
          auVar51 = vcvtdq2ps_avx(auVar51);
          auVar62 = vfmadd213ps_fma(auVar51,auVar79,auVar77);
          uVar6 = *(undefined4 *)((long)puVar2 + 0x34);
          auVar52._4_4_ = uVar6;
          auVar52._0_4_ = uVar6;
          auVar52._8_4_ = uVar6;
          auVar52._12_4_ = uVar6;
          auVar52._16_4_ = uVar6;
          auVar52._20_4_ = uVar6;
          auVar52._24_4_ = uVar6;
          auVar52._28_4_ = uVar6;
          uVar6 = (undefined4)puVar2[8];
          auVar80._4_4_ = uVar6;
          auVar80._0_4_ = uVar6;
          auVar80._8_4_ = uVar6;
          auVar80._12_4_ = uVar6;
          auVar80._16_4_ = uVar6;
          auVar80._20_4_ = uVar6;
          auVar80._24_4_ = uVar6;
          auVar80._28_4_ = uVar6;
          auVar34._8_8_ = 0;
          auVar34._0_8_ = puVar2[2];
          auVar51 = vpmovzxbd_avx2(auVar34);
          auVar51 = vcvtdq2ps_avx(auVar51);
          auVar34 = vfmadd213ps_fma(auVar51,auVar80,auVar52);
          auVar35._8_8_ = 0;
          auVar35._0_8_ = puVar2[3];
          auVar51 = vpmovzxbd_avx2(auVar35);
          auVar51 = vcvtdq2ps_avx(auVar51);
          auVar35 = vfmadd213ps_fma(auVar51,auVar80,auVar52);
          uVar6 = (undefined4)puVar2[7];
          auVar78._4_4_ = uVar6;
          auVar78._0_4_ = uVar6;
          auVar78._8_4_ = uVar6;
          auVar78._12_4_ = uVar6;
          auVar78._16_4_ = uVar6;
          auVar78._20_4_ = uVar6;
          auVar78._24_4_ = uVar6;
          auVar78._28_4_ = uVar6;
          uVar6 = *(undefined4 *)((long)puVar2 + 0x44);
          auVar81._4_4_ = uVar6;
          auVar81._0_4_ = uVar6;
          auVar81._8_4_ = uVar6;
          auVar81._12_4_ = uVar6;
          auVar81._16_4_ = uVar6;
          auVar81._20_4_ = uVar6;
          auVar81._24_4_ = uVar6;
          auVar81._28_4_ = uVar6;
          auVar36._8_8_ = 0;
          auVar36._0_8_ = puVar2[4];
          auVar51 = vpmovzxbd_avx2(auVar36);
          auVar51 = vcvtdq2ps_avx(auVar51);
          auVar36 = vfmadd213ps_fma(auVar51,auVar81,auVar78);
          auVar37._8_8_ = 0;
          auVar37._0_8_ = puVar2[5];
          auVar51 = vpmovzxbd_avx2(auVar37);
          auVar51 = vcvtdq2ps_avx(auVar51);
          auVar37 = vfmadd213ps_fma(auVar51,auVar81,auVar78);
          uVar24 = vcmpps_avx512vl(ZEXT1632(auVar62),auVar22,1);
          auVar23._4_4_ = fVar3 + fVar15;
          auVar23._0_4_ = fVar3 + fVar14;
          auVar23._8_4_ = fVar3 + fVar16;
          auVar23._12_4_ = fVar3 + fVar17;
          auVar23._16_4_ = fVar3 + fVar18;
          auVar23._20_4_ = fVar3 + fVar19;
          auVar23._24_4_ = fVar3 + fVar20;
          auVar23._28_4_ = fVar82;
          uVar25 = vcmpps_avx512vl(ZEXT1632(auVar55),auVar23,6);
          auVar84._4_4_ = fVar68;
          auVar84._0_4_ = fVar61;
          auVar84._8_4_ = fVar69;
          auVar84._12_4_ = fVar70;
          auVar84._16_4_ = fVar71;
          auVar84._20_4_ = fVar72;
          auVar84._24_4_ = fVar73;
          auVar84._28_4_ = fVar74;
          uVar30 = vcmpps_avx512vl(ZEXT1632(auVar34),auVar84,6);
          uVar26 = vcmpps_avx512vl(ZEXT1632(auVar35),auVar56,1);
          uVar27 = vcmpps_avx512vl(ZEXT1632(auVar37),auVar63,1);
          uVar28 = vcmpps_avx512vl(ZEXT1632(auVar36),auVar64,6);
          uVar29 = vcmpps_avx512vl(ZEXT1632(auVar55),ZEXT1632(auVar62),2);
          bVar39 = (byte)uVar31 & (byte)uVar29 &
                   ~((byte)uVar25 | (byte)uVar24 | (byte)uVar30 | (byte)uVar26 | (byte)uVar28 |
                    (byte)uVar27);
        }
        if (bVar39 != 0) {
          uVar46 = (ulong)bVar39;
          lVar45 = lVar42 * 0x90 + (uVar48 & 0xfffffffffffffff0);
          do {
            lVar32 = 0;
            for (uVar33 = uVar46; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
              lVar32 = lVar32 + 1;
            }
            uVar12 = *(uint *)(lVar45 + 0x88);
            uVar13 = *(uint *)(lVar45 + 4 + lVar32 * 8);
            this = (context->scene->geometries).items[uVar12].ptr;
            context->geomID = uVar12;
            context->primID = uVar13;
            bVar38 = Geometry::pointQuery(this,query,context);
            bVar47 = bVar47 | bVar38;
            uVar46 = uVar46 - 1 & uVar46;
          } while (uVar46 != 0);
        }
        lVar42 = lVar42 + 1;
        in_ZMM14 = ZEXT3264(auVar76);
      } while (lVar42 != uVar43 - 8);
      auVar88 = ZEXT1664(auVar87);
      auVar51 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
      auVar85 = ZEXT3264(auVar51);
      auVar86 = ZEXT3264(CONCAT428(0xfffffff8,
                                   CONCAT424(0xfffffff8,
                                             CONCAT420(0xfffffff8,
                                                       CONCAT416(0xfffffff8,
                                                                 CONCAT412(0xfffffff8,
                                                                           CONCAT48(0xfffffff8,
                                                                                                                                                                        
                                                  0xfffffff8fffffff8)))))));
      in_ZMM6 = ZEXT3264(in_ZMM6._0_32_);
    } while (bVar47 == 0);
    uVar6 = *(undefined4 *)&(context->query_radius).field_0;
    auVar56._4_4_ = uVar6;
    auVar56._0_4_ = uVar6;
    auVar56._8_4_ = uVar6;
    auVar56._12_4_ = uVar6;
    auVar56._16_4_ = uVar6;
    auVar56._20_4_ = uVar6;
    auVar56._24_4_ = uVar6;
    auVar56._28_4_ = uVar6;
    uVar6 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
    auVar63._4_4_ = uVar6;
    auVar63._0_4_ = uVar6;
    auVar63._8_4_ = uVar6;
    auVar63._12_4_ = uVar6;
    auVar63._16_4_ = uVar6;
    auVar63._20_4_ = uVar6;
    auVar63._24_4_ = uVar6;
    auVar63._28_4_ = uVar6;
    uVar6 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
    auVar76._4_4_ = uVar6;
    auVar76._0_4_ = uVar6;
    auVar76._8_4_ = uVar6;
    auVar76._12_4_ = uVar6;
    auVar76._16_4_ = uVar6;
    auVar76._20_4_ = uVar6;
    auVar76._24_4_ = uVar6;
    auVar76._28_4_ = uVar6;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      auVar88 = ZEXT464((uint)(query->radius * query->radius));
    }
    else {
      aVar7 = (context->query_radius).field_0;
      auVar87 = vdpps_avx((undefined1  [16])aVar7,(undefined1  [16])aVar7,0x7f);
      auVar88 = ZEXT1664(auVar87);
    }
    bVar40 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }